

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_proxy_auth(Curl_easy *data,connectdata *conn)

{
  char *pcVar1;
  char *local_40;
  char *local_38;
  CURLcode local_2c;
  CURLcode result;
  char *proxypasswd;
  char *proxyuser;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((data->state).aptr.proxyuser == (char *)0x0) {
    local_38 = "";
  }
  else {
    local_38 = (data->state).aptr.proxyuser;
  }
  if ((data->state).aptr.proxypasswd == (char *)0x0) {
    local_40 = "";
  }
  else {
    local_40 = (data->state).aptr.proxypasswd;
  }
  local_2c = CURLE_OUT_OF_MEMORY;
  pcVar1 = (*Curl_cstrdup)(local_38);
  (conn->http_proxy).user = pcVar1;
  if ((conn->http_proxy).user != (char *)0x0) {
    pcVar1 = (*Curl_cstrdup)(local_40);
    (conn->http_proxy).passwd = pcVar1;
    if ((conn->http_proxy).passwd == (char *)0x0) {
      (*Curl_cfree)((conn->http_proxy).user);
      (conn->http_proxy).user = (char *)0x0;
    }
    else {
      local_2c = CURLE_OK;
    }
  }
  return local_2c;
}

Assistant:

static CURLcode parse_proxy_auth(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  const char *proxyuser = data->state.aptr.proxyuser ?
    data->state.aptr.proxyuser : "";
  const char *proxypasswd = data->state.aptr.proxypasswd ?
    data->state.aptr.proxypasswd : "";
  CURLcode result = CURLE_OUT_OF_MEMORY;

  conn->http_proxy.user = strdup(proxyuser);
  if(conn->http_proxy.user) {
    conn->http_proxy.passwd = strdup(proxypasswd);
    if(conn->http_proxy.passwd)
      result = CURLE_OK;
    else
      Curl_safefree(conn->http_proxy.user);
  }
  return result;
}